

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_set_i32_1d(ggml_tensor *tensor,int i,int32_t value)

{
  undefined8 uVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  
  auVar3._4_12_ = in_ZMM0._4_12_;
  switch(tensor->type) {
  case GGML_TYPE_Q4_0:
    pcVar2 = "false";
    uVar1 = 0xb36;
    break;
  case GGML_TYPE_Q4_1:
    pcVar2 = "false";
    uVar1 = 0xb3a;
    break;
  case GGML_TYPE_I8:
    if (tensor->nb[0] == 1) {
      *(char *)((long)tensor->data + (long)i) = (char)value;
      return;
    }
    pcVar2 = "tensor->nb[0] == sizeof(int8_t)";
    uVar1 = 0xb3e;
    break;
  case GGML_TYPE_I16:
    if (tensor->nb[0] == 2) {
      *(short *)((long)tensor->data + (long)i * 2) = (short)value;
      return;
    }
    pcVar2 = "tensor->nb[0] == sizeof(int16_t)";
    uVar1 = 0xb43;
    break;
  case GGML_TYPE_I32:
    if (tensor->nb[0] == 4) {
      *(int32_t *)((long)tensor->data + (long)i * 4) = value;
      return;
    }
    pcVar2 = "tensor->nb[0] == sizeof(int32_t)";
    uVar1 = 0xb48;
    break;
  case GGML_TYPE_F16:
    if (tensor->nb[0] == 2) {
      auVar3._0_4_ = (float)value;
      auVar3 = vcvtps2ph_f16c(auVar3,0);
      vpextrw_avx(auVar3,0);
      return;
    }
    pcVar2 = "tensor->nb[0] == sizeof(ggml_fp16_t)";
    uVar1 = 0xb4d;
    break;
  case GGML_TYPE_F32:
    if (tensor->nb[0] == 4) {
      *(float *)((long)tensor->data + (long)i * 4) = (float)value;
      return;
    }
    pcVar2 = "tensor->nb[0] == sizeof(float)";
    uVar1 = 0xb52;
    break;
  case GGML_TYPE_COUNT:
    pcVar2 = "false";
    uVar1 = 0xb57;
    break;
  default:
    return;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar1,
          pcVar2);
  abort();
}

Assistant:

void ggml_set_i32_1d(const struct ggml_tensor * tensor, int i, int32_t value) {
    switch (tensor->type) {
        case GGML_TYPE_Q4_0:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_Q4_1:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_I8:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int8_t));
                ((int8_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int16_t));
                ((int16_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int32_t));
                ((int32_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_fp16_t));
                ((ggml_fp16_t *)(tensor->data))[i] = GGML_FP32_TO_FP16(value);
            } break;
        case GGML_TYPE_F32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(float));
                ((float *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }
}